

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

void goto_level(d_level *newlevel,boolean at_stairs,boolean falling,boolean portal)

{
  monst *pmVar1;
  byte bVar2;
  bool bVar3;
  level *oldlev;
  schar sVar4;
  schar sVar5;
  boolean bVar6;
  xchar xVar7;
  xchar xVar8;
  boolean bVar9;
  char cVar10;
  char y_00;
  int iVar11;
  s_level *psVar12;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  monst *local_1b8;
  monst *local_1b0;
  d_level *local_198;
  char local_178 [4];
  int which;
  char buf [256];
  char *mesg;
  coord cc;
  dest_area *pdStack_68;
  int trycnt;
  dest_area *udst;
  xchar y;
  trap *ptStack_58;
  xchar x;
  trap *ttrap;
  s_level *first_plane;
  level *origlev;
  obj *otmp;
  monst *mtmp2;
  monst *mtmp;
  boolean new;
  boolean familiar;
  boolean was_in_W_tower;
  boolean newdungeon;
  boolean up;
  xchar new_ledger;
  boolean portal_local;
  boolean falling_local;
  boolean at_stairs_local;
  d_level *newlevel_local;
  
  sVar4 = depth(newlevel);
  sVar5 = depth(&u.uz);
  bVar14 = u.uz.dnum != newlevel->dnum;
  bVar6 = In_W_tower(level,(int)u.ux,(int)u.uy);
  bVar3 = false;
  xVar7 = dunlev(newlevel);
  xVar8 = dunlevs_in_dungeon(newlevel);
  if (xVar8 < xVar7) {
    xVar7 = dunlevs_in_dungeon(newlevel);
    newlevel->dlevel = xVar7;
  }
  if ((bVar14) && (newlevel->dnum == dungeon_topology.d_astral_level.dnum)) {
    if ((u.uhave._0_1_ & 1) == 0) {
      return;
    }
    psVar12 = get_first_elemental_plane();
    pline("Well done, mortal!");
    pline("But now thou must face the final Test...");
    pline("Prove thyself worthy or perish!");
    if (psVar12 == (s_level *)0x0) {
      local_198 = (d_level *)0x0;
    }
    else {
      local_198 = &psVar12->dlevel;
    }
    assign_level(newlevel,local_198);
  }
  xVar7 = ledger_no(newlevel);
  if (xVar7 < '\x01') {
    done(0xf);
  }
  bVar9 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
  if (((bVar9 == '\0') || (bVar14)) || (bVar9 = ok_to_quest(), bVar9 != '\0')) {
    bVar9 = on_level(newlevel,&u.uz);
    if (bVar9 == '\0') {
      if (falling != '\0') {
        impact_drop((obj *)0x0,u.ux,u.uy,newlevel->dlevel);
      }
      check_special_room('\x01');
      if (uball != (obj *)0x0) {
        unplacebc();
      }
      u.utrap = 0;
      fill_pit(level,(int)u.ux,(int)u.uy);
      u.ustuck = (monst *)0x0;
      u._1052_1_ = u._1052_1_ & 0x79;
      bVar9 = on_level(newlevel,&dungeon_topology.d_blackmarket_level);
      if (bVar9 == '\0') {
        bVar9 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
        if (bVar9 == '\0') {
          keepdogs(0,(char *)0x0);
        }
        else {
          keepdogs(2,"can\'t follow you through the portal.");
        }
      }
      else {
        keepdogs(2,"can\'t follow you into the Black Market.");
      }
      if ((u._1052_1_ & 1) != 0) {
        u._1052_1_ = u._1052_1_ & 0xfe;
        u.uswldtim = 0;
      }
      vision_recalc(2);
      if ((level->flags).purge_monsters != 0) {
        dmonsfree(level);
      }
      update_mlstmv();
      assign_level(&u.uz0,&u.uz);
      assign_level(&u.uz,newlevel);
      assign_level(&u.utolev,newlevel);
      u.utotype = '\0';
      if (dungeons[u.uz.dnum].entry_lev == '\x01') {
        cVar10 = dungeons[u.uz.dnum].dunlev_ureached;
        xVar8 = dunlev(&u.uz);
        if (cVar10 < xVar8) {
          xVar8 = dunlev(&u.uz);
          dungeons[u.uz.dnum].dunlev_ureached = xVar8;
        }
      }
      else {
        cVar10 = dungeons[u.uz.dnum].dunlev_ureached;
        xVar8 = dunlev(&u.uz);
        if ((xVar8 < cVar10) || (dungeons[u.uz.dnum].dunlev_ureached == '\0')) {
          xVar8 = dunlev(&u.uz);
          dungeons[u.uz.dnum].dunlev_ureached = xVar8;
        }
      }
      reset_rndmonst(-1);
      oldlev = level;
      level = (level *)0x0;
      if (levels[xVar7] == (level *)0x0) {
        pcVar13 = hist_lev_name(&u.uz,'\0');
        historic_event('\0',"reached %s.",pcVar13);
        level = mklev(&u.uz);
        bVar3 = true;
      }
      else {
        level = levels[xVar7];
        mtmp2 = level->monlist;
        while (mtmp2 != (monst *)0x0) {
          pmVar1 = mtmp2->nmon;
          if ((uint)level->lastmoves < moves) {
            mon_catchup_elapsed_time(mtmp2,(ulong)(moves - level->lastmoves));
          }
          restore_cham(mtmp2);
          mtmp2 = pmVar1;
        }
        catchup_dgn_growths(level,(moves - level->lastmoves) / 5);
      }
      transfer_timers(oldlev,level,0);
      transfer_lights(oldlev,level,0);
      vision_reset();
      vision_full_recalc = '\0';
      flush_screen_disable();
      if ((portal == '\0') || (u.uz.dnum == dungeon_topology.d_astral_level.dnum)) {
        if ((at_stairs == '\0') || (u.uz.dnum == dungeon_topology.d_astral_level.dnum)) {
          if ((bVar6 == '\0') || (bVar6 = On_W_tower_level(&u.uz), bVar6 == '\0')) {
            if (sVar5 <= sVar4) {
              place_lregion(level,(level->dndest).lx,(level->dndest).ly,(level->dndest).hx,
                            (level->dndest).hy,(level->dndest).nlx,(level->dndest).nly,
                            (level->dndest).nhx,(level->dndest).nhy,'\x06',(d_level *)0x0);
            }
            else {
              place_lregion(level,(level->updest).lx,(level->updest).ly,(level->updest).hx,
                            (level->updest).hy,(level->updest).nlx,(level->updest).nly,
                            (level->updest).nhx,(level->updest).nhy,'\x05',(d_level *)0x0);
            }
          }
          else {
            place_lregion(level,(level->dndest).nlx,(level->dndest).nly,(level->dndest).nhx,
                          (level->dndest).nhy,'\0','\0','\0','\0','\x06',(d_level *)0x0);
          }
          if (falling != '\0') {
            if (uball != (obj *)0x0) {
              ballfall();
            }
            selftouch("Falling, you");
          }
        }
        else if (sVar5 <= sVar4) {
          if (at_ladder == '\0') {
            if (bVar14) {
              u_on_sstairs();
            }
            else {
              u_on_upstairs();
            }
          }
          else {
            u_on_newpos((int)(level->upladder).sx,(int)(level->upladder).sy);
          }
          if ((at_stairs == '\0') ||
             (((u.uprops[0x3c].extrinsic == 0 && (((youmonst.data)->mflags1 & 1) == 0)) &&
              ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))))) {
            if ((at_stairs != '\0') &&
               (((iVar11 = near_capacity(), 0 < iVar11 ||
                 ((uball != (obj *)0x0 &&
                  (((uwep != uball || (u.weapon_skills[0xe].skill < '\x02')) ||
                   (urole.malenum != 0x15d)))))) ||
                ((u.uprops[0x25].intrinsic != 0 || (u.uprops[0x25].extrinsic != 0)))))) {
              pcVar13 = "stairs";
              if (at_ladder != '\0') {
                pcVar13 = "ladder";
              }
              pline("You fall down the %s.",pcVar13);
              if ((uball != (obj *)0x0) && (drag_down(), uball->where == '\x03')) {
                if (uwep == uball) {
                  setuwep((obj *)0x0);
                }
                if (uswapwep == uball) {
                  setuswapwep((obj *)0x0);
                }
                if (uquiver == uball) {
                  setuqwep((obj *)0x0);
                }
                freeinv(uball);
              }
              if (u.usteed == (monst *)0x0) {
                iVar11 = rnd(3);
                losehp(iVar11,"falling downstairs",1);
              }
              else {
                dismount_steed(1);
              }
              selftouch("Falling, you");
            }
          }
          else {
            pcVar13 = "stairs";
            if (at_ladder != '\0') {
              pcVar13 = "ladder";
            }
            pline("You fly down along the %s.",pcVar13);
          }
        }
        else {
          if (at_ladder == '\0') {
            if (bVar14) {
              bVar6 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
              if (bVar6 == '\0') {
                u_on_sstairs();
              }
              else {
                pdStack_68 = &level->updest;
                mesg._4_4_ = 0;
                do {
                  do {
                    iVar11 = rn2(((int)pdStack_68->hx - (int)pdStack_68->lx) + 1);
                    cVar10 = (char)iVar11 + pdStack_68->lx;
                    iVar11 = rn2(((int)pdStack_68->hy - (int)pdStack_68->ly) + 1);
                    y_00 = (char)iVar11 + pdStack_68->ly;
                    if (((cVar10 < pdStack_68->nlx) || (bVar15 = false, pdStack_68->nhx < cVar10))
                       && (bVar15 = true, pdStack_68->nly <= y_00)) {
                      bVar15 = pdStack_68->nhy < y_00;
                    }
                  } while (bVar15);
                  bVar6 = occupied(level,cVar10,y_00);
                  if ((bVar6 != '\0') || (bVar15 = false, level->locations[cVar10][y_00].typ < '\r')
                     ) {
                    bVar15 = mesg._4_4_ < 1000;
                    mesg._4_4_ = mesg._4_4_ + 1;
                  }
                } while (bVar15);
                if (999 < mesg._4_4_) {
                  warning("Castle: placement failed to find good pos");
                }
                u_on_newpos((int)cVar10,(int)y_00);
              }
            }
            else {
              u_on_dnstairs();
            }
          }
          else {
            u_on_newpos((int)(level->dnladder).sx,(int)(level->dnladder).sy);
          }
          if (((uball != (obj *)0x0) && (u.uprops[0x12].intrinsic == 0)) &&
             ((u.uprops[0x12].extrinsic == 0 && ((youmonst.data)->mlet != '\x05')))) {
            pcVar13 = "stairs";
            if (at_ladder != '\0') {
              pcVar13 = "ladder";
            }
            pline("With great effort you climb the %s.",pcVar13);
          }
        }
      }
      else {
        for (ptStack_58 = level->lev_traps;
            (ptStack_58 != (trap *)0x0 && ((ptStack_58->field_0x8 & 0x1f) != 0x12));
            ptStack_58 = ptStack_58->ntrap) {
        }
        if (ptStack_58 == (trap *)0x0) {
          panic("goto_level: no corresponding portal!");
        }
        seetrap(ptStack_58);
        u_on_newpos((int)ptStack_58->tx,(int)ptStack_58->ty);
      }
      if (uball != (obj *)0x0) {
        placebc();
      }
      while (level->objects[0][0] != (obj *)0x0) {
        deliver_object(level->objects[0][0],u.uz.dnum,u.uz.dlevel,9);
      }
      for (origlev = (level *)invent; origlev != (level *)0x0; origlev = *(level **)origlev->levname
          ) {
        set_obj_level(level,(obj *)origlev);
      }
      losedogs();
      kill_genocided_monsters();
      run_timers();
      initrack();
      if ((level->monsters[u.ux][u.uy] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[u.ux][u.uy]->field_0x60 >> 9 & 1) != 0)) {
        local_1b0 = (monst *)0x0;
      }
      else {
        local_1b0 = level->monsters[u.ux][u.uy];
      }
      if ((local_1b0 != (monst *)0x0) && (local_1b0 != u.usteed)) {
        iVar11 = rn2(2);
        if ((iVar11 == 0) &&
           ((bVar6 = enexto((coord *)((long)&mesg + 2),level,u.ux,u.uy,youmonst.data), bVar6 != '\0'
            && (iVar11 = dist2((int)mesg._2_1_,(int)mesg._3_1_,(int)u.ux,(int)u.uy), iVar11 < 3))))
        {
          u_on_newpos((int)mesg._2_1_,(int)mesg._3_1_);
        }
        else {
          mnexto(local_1b0);
        }
        if ((level->monsters[u.ux][u.uy] == (monst *)0x0) ||
           ((*(uint *)&level->monsters[u.ux][u.uy]->field_0x60 >> 9 & 1) != 0)) {
          local_1b8 = (monst *)0x0;
        }
        else {
          local_1b8 = level->monsters[u.ux][u.uy];
        }
        if (local_1b8 != (monst *)0x0) {
          impossible("mnexto failed (do.c)?");
          rloc(level,local_1b8,'\0');
        }
      }
      *(uint *)&level->locations[u.ux][u.uy].field_0x6 =
           *(uint *)&level->locations[u.ux][u.uy].field_0x6 & 0xfffffffb | 4;
      bVar6 = on_level(&u.uz,&dungeon_topology.d_water_level);
      if (bVar6 != '\0') {
        movebubbles();
      }
      bVar15 = (*(uint *)&(level->flags).field_0x8 >> 0x16 & 1) != 0;
      if (bVar15) {
        *(uint *)&(level->flags).field_0x8 = *(uint *)&(level->flags).field_0x8 & 0xffbfffff;
      }
      notify_levelchange((d_level *)0x0);
      vision_reset();
      doredraw();
      flush_screen_enable();
      flush_screen();
      check_special_room('\0');
      bVar6 = In_hell(&u.uz0);
      if ((bVar6 == '\0') && (bVar6 = In_hell(&u.uz), bVar6 != '\0')) {
        bVar6 = on_level(&u.uz,&dungeon_topology.d_valley_level);
        if (bVar6 == '\0') {
          pline("It is hot here.  You smell smoke...");
        }
        else {
          pline("You arrive at the Valley of the Dead...");
          pline("The odor of burnt flesh and decay pervades the air.");
          You_hear("groans and moans everywhere.");
        }
      }
      if (bVar15) {
        iVar11 = rn2(4);
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar6 = dmgtype(youmonst.data,0x24), bVar6 != '\0')))) {
          buf._248_8_ = goto_level::fam_msgs[iVar11];
        }
        else {
          buf._248_8_ = goto_level::halu_fam_msgs[iVar11];
        }
        if ((buf._248_8_ != 0) &&
           (pcVar13 = strchr((char *)buf._248_8_,0x25), pcVar13 != (char *)0x0)) {
          if ((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (bVar2 = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
            bVar15 = false;
            if (ublindf != (obj *)0x0) {
              bVar15 = ublindf->oartifact == '\x1d';
            }
            bVar2 = bVar15 ^ 1;
          }
          pcVar13 = "seems";
          if ((bool)(bVar2 ^ 1)) {
            pcVar13 = "looks";
          }
          sprintf(local_178,(char *)buf._248_8_,pcVar13);
          buf._248_8_ = local_178;
        }
        if (buf._248_8_ != 0) {
          pline((char *)buf._248_8_);
        }
      }
      if ((bVar3) && (bVar6 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar6 != '\0')) {
        pline("You enter what seems to be an older, more primitive world.");
      }
      if (((bVar3) && (u.uprops[0x23].intrinsic != 0)) &&
         ((u.uprops[0x24].extrinsic == 0 &&
          ((((u.umonnum == u.umonster || (bVar6 = dmgtype(youmonst.data,0x24), bVar6 == '\0')) &&
            (urole.malenum == 0x159)) &&
           (bVar6 = on_level(&u.uz,&dungeon_topology.d_juiblex_level), bVar6 != '\0')))))) {
        pline("Ahh, Venice.");
      }
      if (((u.uz.dnum == dungeon_topology.d_astral_level.dnum) && (bVar14)) &&
         ((u.uhave._0_1_ & 1) != 0)) {
        resurrect();
      }
      if (((bVar14) &&
          ((bVar6 = In_V_tower(&u.uz), bVar6 != '\0' ||
           (u.uz.dnum == dungeon_topology.d_dragon_dnum)))) &&
         (bVar6 = In_hell(&u.uz0), bVar6 != '\0')) {
        pline("The heat and smoke are gone.");
      }
      bVar6 = In_quest(&u.uz0);
      if ((((bVar6 == '\0') && (bVar6 = at_dgn_entrance(&u.uz,"The Quest"), bVar6 != '\0')) &&
          (((ushort)u.uevent._0_2_ >> 4 & 1) == 0)) &&
         ((((ushort)u.uevent._0_2_ >> 5 & 1) == 0 && (((uint)quest_status._0_4_ >> 0x14 & 1) == 0)))
         ) {
        if (u.uprops[0x19].blocked == 0) {
          if (((ushort)u.uevent._0_2_ >> 3 & 1) == 0) {
            com_pager(2);
            u.uevent._0_2_ = u.uevent._0_2_ & 0xfff7 | 8;
          }
          else {
            iVar11 = 3;
            if (urole.malenum == 0x164) {
              iVar11 = 4;
            }
            com_pager(iVar11);
          }
        }
        else if (uarmh != (obj *)0x0) {
          pcVar13 = yname(uarmh);
          pline("You sense something being blocked by %s.",pcVar13);
        }
      }
      iVar11 = getmonth();
      if (((iVar11 == 0xc) && (iVar11 = getmday(), iVar11 < 0x19)) &&
         (bVar6 = mk_advcal_portal(level), bVar6 != '\0')) {
        pline("You smell chocolate!");
      }
      bVar6 = on_level(&u.uz,&dungeon_topology.d_advcal_level);
      if (bVar6 != '\0') {
        fill_advent_calendar(level,'\0');
      }
      bVar6 = on_level(&u.uz,&dungeon_topology.d_knox_level);
      if ((bVar6 != '\0') && ((bVar3 || (mvitals[0x129].died == '\0')))) {
        pline("You penetrated a high security area!");
        pline("An alarm sounds!");
        for (mtmp2 = level->monlist; mtmp2 != (monst *)0x0; mtmp2 = mtmp2->nmon) {
          if ((0 < mtmp2->mhp) && ((*(uint *)&mtmp2->field_0x60 >> 0x13 & 1) != 0)) {
            *(uint *)&mtmp2->field_0x60 = *(uint *)&mtmp2->field_0x60 & 0xfff7ffff;
          }
        }
      }
      bVar6 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
      if ((bVar6 != '\0') && ((u.uprops[0x15].intrinsic != 0 || (u.uprops[0x15].extrinsic != 0)))) {
        set_black_marketeer_angry();
      }
      bVar6 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      if (bVar6 == '\0') {
        onquest();
      }
      else {
        final_level();
      }
      assign_level(&u.uz0,&u.uz);
      if (level->levname[0] != '\0') {
        pline("You named this level: %s.",level);
      }
      in_out_region(level,u.ux,u.uy);
      pickup(1);
    }
  }
  else {
    pline("A mysterious force prevents you from descending.");
  }
  return;
}

Assistant:

void goto_level(d_level *newlevel, boolean at_stairs, boolean falling, boolean portal)
{
	xchar new_ledger;
	boolean up = (depth(newlevel) < depth(&u.uz)),
		newdungeon = (u.uz.dnum != newlevel->dnum),
		was_in_W_tower = In_W_tower(level, u.ux, u.uy),
		familiar = FALSE;
	boolean new = FALSE;	/* made a new level? */
	struct monst *mtmp, *mtmp2;
	struct obj *otmp;
	struct level *origlev;

	if (dunlev(newlevel) > dunlevs_in_dungeon(newlevel))
		newlevel->dlevel = dunlevs_in_dungeon(newlevel);
	if (newdungeon && In_endgame(newlevel)) { /* 1st Endgame Level !!! */
		if (u.uhave.amulet) {
		    s_level *first_plane = get_first_elemental_plane();
		    pline("Well done, mortal!");
		    pline("But now thou must face the final Test...");
		    pline("Prove thyself worthy or perish!");
		    assign_level(newlevel, first_plane ? &first_plane->dlevel : NULL);
		} else
		    return;
	}
	new_ledger = ledger_no(newlevel);
	if (new_ledger <= 0)
		done(ESCAPED);	/* in fact < 0 is impossible */

	/* Prevent the player from going past the first quest level unless
	 * (s)he has been given the go-ahead by the leader.
	 */
	if (on_level(&u.uz, &qstart_level) && !newdungeon && !ok_to_quest()) {
		pline("A mysterious force prevents you from descending.");
		return;
	}

	if (on_level(newlevel, &u.uz)) return;		/* this can happen */

	if (falling) /* assuming this is only trap door or hole */
	    impact_drop(NULL, u.ux, u.uy, newlevel->dlevel);

	check_special_room(TRUE);		/* probably was a trap door */
	if (Punished) unplacebc();
	u.utrap = 0;				/* needed in level_tele */
	fill_pit(level, u.ux, u.uy);
	u.ustuck = 0;				/* idem */
	u.uwilldrown = 0;
	u.uinwater = 0;
	u.uundetected = 0;	/* not hidden, even if means are available */

	if (Is_blackmarket(newlevel))
	    keepdogs(2, "can't follow you into the Black Market.");
	else if (Is_blackmarket(&u.uz))
	    keepdogs(2, "can't follow you through the portal.");
	else
	    keepdogs(0, NULL);

	if (u.uswallow)				/* idem */
		u.uswldtim = u.uswallow = 0;
	/*
	 *  We no longer see anything on the level->  Make sure that this
	 *  follows u.uswallow set to null since uswallow overrides all
	 *  normal vision.
	 */
	vision_recalc(2);
	
	if (level->flags.purge_monsters) {
		/* purge any dead monsters */
		dmonsfree(level);
	}
	update_mlstmv();	/* current monsters are becoming inactive */
	

	assign_level(&u.uz0, &u.uz);
	assign_level(&u.uz, newlevel);
	assign_level(&u.utolev, newlevel);
	u.utotype = 0;

	/* If the entry level is the top level, then the dungeon goes down.
	 * Otherwise it goes up. */
	if (dungeons[u.uz.dnum].entry_lev == 1) {
	    if (dunlev_reached(&u.uz) < dunlev(&u.uz))
		dunlev_reached(&u.uz) = dunlev(&u.uz);
	} else {
	    if (dunlev_reached(&u.uz) > dunlev(&u.uz) || !dunlev_reached(&u.uz))
		dunlev_reached(&u.uz) = dunlev(&u.uz);
	}

	reset_rndmonst(NON_PM);   /* u.uz change affects monster generation */

	origlev = level;
	level = NULL;
	
	if (!levels[new_ledger]) {
		/* entering this level for first time; make it now */
		historic_event(FALSE, "reached %s.", hist_lev_name(&u.uz, FALSE));
		level = mklev(&u.uz);
		new = TRUE;	/* made the level */
	} else {
		/* returning to previously visited level */
		level = levels[new_ledger];

		/* regenerate animals while on another level */
		for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
			mtmp2 = mtmp->nmon;
			if (moves > level->lastmoves)
				mon_catchup_elapsed_time(mtmp, moves - level->lastmoves);

			/* update shape-changers in case protection against
			   them is different now */
			restore_cham(mtmp);
		}

		/* grow herbs and/or trees while on another level */
		catchup_dgn_growths(level, (moves - level->lastmoves) / 5);
	}

	/* some timers and lights might need to be transferred to the new level
	 * if they are attached to objects the hero is carrying */
	transfer_timers(origlev, level, 0);
	transfer_lights(origlev, level, 0);

	/* do this prior to level-change pline messages */
	vision_reset();		/* clear old level's line-of-sight */
	vision_full_recalc = 0;	/* don't let that reenable vision yet */
	flush_screen_disable();	/* ensure all map flushes are postponed */

	if (portal && !In_endgame(&u.uz)) {
	    /* find the portal on the new level */
	    struct trap *ttrap;

	    for (ttrap = level->lev_traps; ttrap; ttrap = ttrap->ntrap)
		if (ttrap->ttyp == MAGIC_PORTAL) break;

	    if (!ttrap) panic("goto_level: no corresponding portal!");
	    seetrap(ttrap);
	    u_on_newpos(ttrap->tx, ttrap->ty);
	} else if (at_stairs && !In_endgame(&u.uz)) {
	    if (up) {
		if (at_ladder) {
		    u_on_newpos(level->dnladder.sx, level->dnladder.sy);
		} else {
		    if (newdungeon) {
			if (Is_stronghold(&u.uz)) {
			    xchar x, y;
			    const dest_area *udst = &level->updest;
			    int trycnt = 0;

			    do {
				do {
				    x = rn1((udst->hx - udst->lx) + 1, udst->lx);
				    y = rn1((udst->hy - udst->ly) + 1, udst->ly);
				} while ((x < udst->nlx || x > udst->nhx) &&
					 (y < udst->nly || y > udst->nhy));
			    } while ((occupied(level, x, y) ||
				      IS_STWALL(level->locations[x][y].typ)) &&
				     trycnt++ < 1000);
			    if (trycnt >= 1000)
				warning("Castle: placement failed to find good pos");
			    u_on_newpos(x, y);
			} else u_on_sstairs();
		    } else u_on_dnstairs();
		}
		/* Remove bug which crashes with levitation/punishment  KAA */
		if (Punished && !Levitation) {
			pline("With great effort you climb the %s.",
				at_ladder ? "ladder" : "stairs");
		}
	    } else {	/* down */
		if (at_ladder) {
		    u_on_newpos(level->upladder.sx, level->upladder.sy);
		} else {
		    if (newdungeon) u_on_sstairs();
		    else u_on_upstairs();
		}
		if (at_stairs && Flying)
		    pline("You fly down along the %s.",
			at_ladder ? "ladder" : "stairs");
		else if (at_stairs &&
		    (near_capacity() > UNENCUMBERED ||
		     (Punished && (uwep != uball || P_SKILL(P_FLAIL) < P_BASIC ||
				   !Role_if(PM_CONVICT))) ||
		     Fumbling)) {
		    pline("You fall down the %s.", at_ladder ? "ladder" : "stairs");
		    if (Punished) {
			drag_down();
			if (carried(uball)) {
			    if (uwep == uball)
				setuwep(NULL);
			    if (uswapwep == uball)
				setuswapwep(NULL);
			    if (uquiver == uball)
				setuqwep(NULL);
			    freeinv(uball);
			}
		    }
		    /* falling off steed has its own losehp() call */
		    if (u.usteed)
			dismount_steed(DISMOUNT_FELL);
		    else
			losehp(rnd(3), "falling downstairs", KILLED_BY);
		    selftouch("Falling, you");
		}
	    }
	} else {	/* trap door or level_tele or In_endgame */
	    if (was_in_W_tower && On_W_tower_level(&u.uz))
		/* Stay inside the Wizard's tower when feasible.	*/
		/* Note: up vs down doesn't really matter in this case. */
		place_lregion(level, level->dndest.nlx, level->dndest.nly,
				level->dndest.nhx, level->dndest.nhy,
				0,0, 0,0, LR_DOWNTELE, NULL);
	    else if (up)
		place_lregion(level, level->updest.lx, level->updest.ly,
				level->updest.hx, level->updest.hy,
				level->updest.nlx, level->updest.nly,
				level->updest.nhx, level->updest.nhy,
				LR_UPTELE, NULL);
	    else
		place_lregion(level, level->dndest.lx, level->dndest.ly,
				level->dndest.hx, level->dndest.hy,
				level->dndest.nlx, level->dndest.nly,
				level->dndest.nhx, level->dndest.nhy,
				LR_DOWNTELE, NULL);
	    if (falling) {
		if (Punished) ballfall();
		selftouch("Falling, you");
	    }
	}

	if (Punished) placebc();

	/* only matters if falling;
	 * place objects that fell with the player nearby */
	while (level->objects[0][0]) {
	    deliver_object(level->objects[0][0], u.uz.dnum, u.uz.dlevel,
			   MIGR_NEAR_PLAYER);
	}

	for (otmp = invent; otmp; otmp = otmp->nobj)
	    set_obj_level(level, otmp);
	losedogs();
	kill_genocided_monsters();  /* for those wiped out while in limbo */
	/*
	 * Expire all timers that have gone off while away.  Must be
	 * after migrating monsters and objects are delivered
	 * (losedogs and obj_delivery).
	 */
	run_timers();

	initrack();

	if ((mtmp = m_at(level, u.ux, u.uy)) != 0
		&& mtmp != u.usteed) {
	    /* There's a monster at your target destination; it might be one
	       which accompanied you--see mon_arrive(dogmove.c)--or perhaps
	       it was already here.  Randomly move you to an adjacent spot
	       or else the monster to any nearby location.  Prior to 3.3.0
	       the latter was done unconditionally. */
	    coord cc;

	    if (!rn2(2) &&
		    enexto(&cc, level, u.ux, u.uy, youmonst.data) &&
		    distu(cc.x, cc.y) <= 2)
		u_on_newpos(cc.x, cc.y);	/*[maybe give message here?]*/
	    else
		mnexto(mtmp);

	    if ((mtmp = m_at(level, u.ux, u.uy)) != 0) {
		impossible("mnexto failed (do.c)?");
		rloc(level, mtmp, FALSE);
	    }
	}

	/* Stop autoexplore revisiting the entrance stairs. */
	level->locations[u.ux][u.uy].mem_stepped = 1;

	/* initial movement of bubbles just before vision_recalc */
	if (Is_waterlevel(&u.uz))
		movebubbles();

	if (level->flags.forgotten) {
	    familiar = TRUE;
	    level->flags.forgotten = FALSE;
	}
	
	notify_levelchange(NULL); /* inform window code of the level change */

	/* Reset the screen. */
	vision_reset();		/* reset the blockages */
	doredraw();		/* does a full vision recalc */
	flush_screen_enable();
	flush_screen();

	/*
	 *  Move all plines beyond the screen reset.
	 */

	/* give room entrance message, if any */
	check_special_room(FALSE);

	/* Check whether we just entered Gehennom. */
	if (!In_hell(&u.uz0) && Inhell) {
	    if (Is_valley(&u.uz)) {
		pline("You arrive at the Valley of the Dead...");
		pline("The odor of burnt flesh and decay pervades the air.");
		You_hear("groans and moans everywhere.");
	    } else pline("It is hot here.  You smell smoke...");
	}

	if (familiar) {
	    static const char * const fam_msgs[4] = {
		"You have a sense of deja vu.",
		"You feel like you've been here before.",
		"This place %s familiar...",
		0	/* no message */
	    };
	    static const char * const halu_fam_msgs[4] = {
		"Whoa!  Everything %s different.",
		"You are surrounded by twisty little passages, all alike.",
		"Gee, this %s like uncle Conan's place...",
		0	/* no message */
	    };
	    const char *mesg;
	    char buf[BUFSZ];
	    int which = rn2(4);

	    if (Hallucination)
		mesg = halu_fam_msgs[which];
	    else
		mesg = fam_msgs[which];
	    if (mesg && strchr(mesg, '%')) {
		sprintf(buf, mesg, !Blind ? "looks" : "seems");
		mesg = buf;
	    }
	    if (mesg) pline(mesg);
	}

	if (new && Is_rogue_level(&u.uz))
	    pline("You enter what seems to be an older, more primitive world.");

	if (new && Hallucination && Role_if(PM_ARCHEOLOGIST) &&
		Is_juiblex_level(&u.uz))
	    pline("Ahh, Venice.");

	/* Final confrontation */
	if (In_endgame(&u.uz) && newdungeon && u.uhave.amulet)
		resurrect();
	if (newdungeon && (In_V_tower(&u.uz) || In_dragon(&u.uz)) && In_hell(&u.uz0))
		pline("The heat and smoke are gone.");

	/* the message from your quest leader */
	if (!In_quest(&u.uz0) && at_dgn_entrance(&u.uz, "The Quest") &&
		!(u.uevent.qexpelled || u.uevent.qcompleted || quest_status.leader_is_dead)) {
		if (BTelepat) {
			if (uarmh)
			    pline("You sense something being blocked by %s.",
				  yname(uarmh));
		} else if (u.uevent.qcalled) {
			com_pager(Role_if (PM_ROGUE) ? 4 : 3);
		} else {
			com_pager(2);
			u.uevent.qcalled = TRUE;
		}
	}

	if (getmonth() == 12 && getmday() < 25) {
		if (mk_advcal_portal(level))
			pline("You smell chocolate!");
	}
	if (Is_advent_calendar(&u.uz))
		fill_advent_calendar(level, FALSE);

	/* once Croesus is dead, his alarm doesn't work any more */
	if (Is_knox(&u.uz) && (new || !mvitals[PM_CROESUS].died)) {
		pline("You penetrated a high security area!");
		pline("An alarm sounds!");
		for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
		    if (!DEADMONSTER(mtmp) && mtmp->msleeping) mtmp->msleeping = 0;
	}

	if (Is_blackmarket(&u.uz) && Conflict)
	    set_black_marketeer_angry();

	if (on_level(&u.uz, &astral_level))
	    final_level();
	else
	    onquest();
	assign_level(&u.uz0, &u.uz); /* reset u.uz0 */
	
	if (*level->levname)
	    pline("You named this level: %s.", level->levname);

	/* assume this will always return TRUE when changing level */
	in_out_region(level, u.ux, u.uy);
	pickup(1);
}